

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

MemTxResult
access_with_adjusted_size
          (uc_struct_conflict15 *uc,hwaddr addr,uint64_t *value,uint size,uint access_size_min,
          uint access_size_max,
          _func_MemTxResult_uc_struct_ptr_MemoryRegion_ptr_hwaddr_uint64_t_ptr_uint_int_uint64_t_MemTxAttrs_conflict14
          *access_fn,MemoryRegion_conflict *mr,MemTxAttrs attrs)

{
  _Bool _Var1;
  MemTxResult MVar2;
  ulong uVar3;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  MemTxResult r;
  uint i;
  uint access_size;
  uint64_t access_mask;
  uint local_30;
  uint access_size_max_local;
  uint access_size_min_local;
  uint size_local;
  uint64_t *value_local;
  hwaddr addr_local;
  uc_struct_conflict15 *uc_local;
  MemTxAttrs attrs_local;
  
  local_4c = 0;
  local_30 = access_size_min;
  if (access_size_min == 0) {
    local_30 = 1;
  }
  access_mask._4_4_ = access_size_max;
  if (access_size_max == 0) {
    access_mask._4_4_ = 4;
  }
  local_50 = size;
  if (access_mask._4_4_ <= size) {
    local_50 = access_mask._4_4_;
  }
  if (local_30 < local_50) {
    local_54 = size;
    if (access_mask._4_4_ <= size) {
      local_54 = access_mask._4_4_;
    }
    local_58 = local_54;
  }
  else {
    local_58 = local_30;
  }
  uVar3 = 0xffffffffffffffff >> (0x40U - (char)(local_58 << 3) & 0x3f);
  _Var1 = memory_region_big_endian(mr);
  if (_Var1) {
    for (local_48 = 0; local_48 < size; local_48 = local_58 + local_48) {
      MVar2 = (*access_fn)(uc,mr,addr + local_48,value,local_58,((size - local_58) - local_48) * 8,
                           uVar3,attrs);
      local_4c = MVar2 | local_4c;
    }
  }
  else {
    for (local_48 = 0; local_48 < size; local_48 = local_58 + local_48) {
      MVar2 = (*access_fn)(uc,mr,addr + local_48,value,local_58,local_48 << 3,uVar3,attrs);
      local_4c = MVar2 | local_4c;
    }
  }
  return local_4c;
}

Assistant:

static MemTxResult access_with_adjusted_size(struct uc_struct *uc, hwaddr addr,
                                      uint64_t *value,
                                      unsigned size,
                                      unsigned access_size_min,
                                      unsigned access_size_max,
                                      MemTxResult (*access_fn)
                                                  (struct uc_struct *uc,
                                                   MemoryRegion *mr,
                                                   hwaddr addr,
                                                   uint64_t *value,
                                                   unsigned size,
                                                   signed shift,
                                                   uint64_t mask,
                                                   MemTxAttrs attrs),
                                      MemoryRegion *mr,
                                      MemTxAttrs attrs)
{
    uint64_t access_mask;
    unsigned access_size;
    unsigned i;
    MemTxResult r = MEMTX_OK;

    if (!access_size_min) {
        access_size_min = 1;
    }
    if (!access_size_max) {
        access_size_max = 4;
    }

    /* FIXME: support unaligned access? */
    access_size = MAX(MIN(size, access_size_max), access_size_min);
    access_mask = MAKE_64BIT_MASK(0, access_size * 8);
    if (memory_region_big_endian(mr)) {
        for (i = 0; i < size; i += access_size) {
            r |= access_fn(uc, mr, addr + i, value, access_size,
                        (size - access_size - i) * 8, access_mask, attrs);
        }
    } else {
        for (i = 0; i < size; i += access_size) {
            r |= access_fn(uc, mr, addr + i, value, access_size, i * 8,
                        access_mask, attrs);
        }
    }
    return r;
}